

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O3

void __thiscall
unitStringDefinitions_nonenglishVector_Test::~unitStringDefinitions_nonenglishVector_Test
          (unitStringDefinitions_nonenglishVector_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStringDefinitions, nonenglishVector)
{
    for (std::size_t ii = 0;
         ii < units::defined_unit_strings_non_english.size();
         ++ii) {
        EXPECT_TRUE(
            units::defined_unit_strings_non_english[ii].first != nullptr)
            << ii;
        if (units::defined_unit_strings_non_english[ii].first == nullptr) {
            break;
        }
    }
}